

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall
tetgenmesh::flip23(tetgenmesh *this,triface *fliptets,int hullflag,flipconstraints *fc)

{
  triface *ptVar1;
  tetrahedron ppdVar2;
  tetrahedron p3;
  tetgenmesh *p3_00;
  tetgenmesh *this_00;
  tetrahedron p0;
  tetrahedron ppdVar3;
  memorypool *pmVar4;
  tetgenmesh *ptVar5;
  tetgenio *ptVar6;
  long lVar7;
  tetrahedron *pppdVar8;
  tetrahedron *pppdVar9;
  tetrahedron *pppdVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  flipconstraints *pfVar16;
  undefined7 uVar17;
  tetgenmesh *ptVar18;
  long lVar19;
  ulong uVar20;
  bool bVar21;
  double dVar22;
  double dVar23;
  triface local_120;
  flipconstraints *local_110;
  undefined4 local_104;
  undefined4 local_100;
  undefined4 local_fc;
  face checkseg;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  triface topcastets [3];
  triface botcastets [3];
  
  lVar7 = 8;
  do {
    *(undefined8 *)((long)topcastets + lVar7 + -8) = 0;
    *(undefined4 *)((long)&topcastets[0].tet + lVar7) = 0;
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x38);
  lVar7 = 8;
  do {
    *(undefined8 *)((long)&topcastets[2].ver + lVar7) = 0;
    *(undefined4 *)((long)&botcastets[0].tet + lVar7) = 0;
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x38);
  local_120.tet = (tetrahedron *)0x0;
  local_120.ver = 0;
  if (hullflag < 1) {
    pppdVar10 = fliptets->tet;
    iVar11 = fliptets->ver;
    pppdVar9 = fliptets[1].tet;
    iVar12 = fliptets[1].ver;
LAB_00113a39:
    local_fc = 0;
    iVar14 = iVar12;
LAB_00113a41:
    local_100 = 0;
    local_104 = 0;
    pppdVar8 = pppdVar10;
    pppdVar10 = pppdVar9;
    iVar12 = iVar11;
  }
  else {
    pppdVar10 = fliptets->tet;
    pppdVar9 = fliptets[1].tet;
    iVar12 = fliptets[1].ver;
    iVar11 = oppopivot[iVar12];
    ppdVar2 = (tetrahedron)this->dummypoint;
    uVar17 = (undefined7)((ulong)pppdVar10 >> 8);
    if (pppdVar9[iVar11] == ppdVar2) {
      iVar14 = fliptets->ver;
      fliptets->tet = pppdVar9;
      fliptets->ver = iVar12;
      fliptets[1].tet = pppdVar10;
      fliptets[1].ver = iVar14;
      local_fc = (undefined4)CONCAT71((int7)(int3)((uint)iVar11 >> 8),1);
      local_104 = 0;
      local_100 = (undefined4)CONCAT71(uVar17,1);
      pppdVar8 = pppdVar9;
      local_120.tet = pppdVar10;
      local_120.ver = iVar14;
    }
    else {
      iVar11 = fliptets->ver;
      if (pppdVar10[orgpivot[iVar11]] != ppdVar2) {
        if (pppdVar10[destpivot[iVar11]] != ppdVar2) goto LAB_00113a39;
        iVar11 = eprevtbl[iVar11];
        fliptets->ver = iVar11;
        iVar14 = enexttbl[iVar12];
        fliptets[1].ver = iVar14;
        local_fc = 0x172501;
        goto LAB_00113a41;
      }
      iVar11 = enexttbl[iVar11];
      fliptets->ver = iVar11;
      iVar14 = eprevtbl[iVar12];
      fliptets[1].ver = iVar14;
      local_fc = 0x172501;
      local_100 = 0;
      local_104 = (undefined4)CONCAT71(uVar17,1);
      pppdVar8 = pppdVar10;
      pppdVar10 = pppdVar9;
      iVar12 = iVar11;
    }
  }
  ppdVar2 = pppdVar8[orgpivot[iVar12]];
  p3 = pppdVar8[destpivot[iVar12]];
  p3_00 = (tetgenmesh *)pppdVar8[apexpivot[iVar12]];
  this_00 = (tetgenmesh *)pppdVar8[oppopivot[iVar12]];
  p0 = pppdVar10[oppopivot[iVar14]];
  this->flip23count = this->flip23count + 1;
  ptVar1 = fliptets + 1;
  local_110 = fc;
  for (lVar7 = 0; lVar7 != 0x30; lVar7 = lVar7 + 0x10) {
    fnext(this,fliptets,(triface *)((long)&topcastets[0].tet + lVar7));
    fliptets->ver = enexttbl[fliptets->ver];
  }
  for (lVar7 = 0; lVar7 != 0x30; lVar7 = lVar7 + 0x10) {
    fnext(this,ptVar1,(triface *)((long)&botcastets[0].tet + lVar7));
    fliptets[1].ver = eprevtbl[fliptets[1].ver];
  }
  fliptets->ver = 0xb;
  fliptets[1].ver = 0xb;
  pppdVar10 = fliptets->tet;
  *(undefined4 *)((long)pppdVar10 + (long)this->elemmarkerindex * 4) = 0;
  pppdVar9 = fliptets[1].tet;
  *(undefined4 *)((long)pppdVar9 + (long)this->elemmarkerindex * 4) = 0;
  if (this->checksubsegflag != 0) {
    ppdVar3 = pppdVar10[8];
    if (ppdVar3 != (tetrahedron)0x0) {
      pmVar4 = this->tet2segpool;
      *ppdVar3 = (double *)pmVar4->deaditemstack;
      pmVar4->deaditemstack = ppdVar3;
      pmVar4->items = pmVar4->items + -1;
      fliptets->tet[8] = (tetrahedron)0x0;
      pppdVar9 = fliptets[1].tet;
    }
    ppdVar3 = pppdVar9[8];
    if (ppdVar3 != (tetrahedron)0x0) {
      pmVar4 = this->tet2segpool;
      *ppdVar3 = (double *)pmVar4->deaditemstack;
      pmVar4->deaditemstack = ppdVar3;
      pmVar4->items = pmVar4->items + -1;
      ptVar1->tet[8] = (tetrahedron)0x0;
    }
  }
  if (this->checksubfaceflag != 0) {
    ppdVar3 = fliptets->tet[9];
    if (ppdVar3 != (tetrahedron)0x0) {
      pmVar4 = this->tet2subpool;
      *ppdVar3 = (double *)pmVar4->deaditemstack;
      pmVar4->deaditemstack = ppdVar3;
      pmVar4->items = pmVar4->items + -1;
      fliptets->tet[9] = (tetrahedron)0x0;
    }
    ppdVar3 = ptVar1->tet[9];
    if (ppdVar3 != (tetrahedron)0x0) {
      pmVar4 = this->tet2subpool;
      *ppdVar3 = (double *)pmVar4->deaditemstack;
      pmVar4->deaditemstack = ppdVar3;
      pmVar4->items = pmVar4->items + -1;
      ptVar1->tet[9] = (tetrahedron)0x0;
    }
  }
  ptVar1 = fliptets + 2;
  maketetrahedron(this,ptVar1);
  lVar7 = (long)this->elemattribindex;
  uVar13 = 0;
  if (0 < this->numelemattrib) {
    uVar13 = (ulong)(uint)this->numelemattrib;
  }
  while (bVar21 = uVar13 != 0, uVar13 = uVar13 - 1, bVar21) {
    fliptets[2].tet[lVar7] = fliptets->tet[lVar7];
    lVar7 = lVar7 + 1;
  }
  if (this->b->varvolume != 0) {
    fliptets[2].tet[this->volumeboundindex] = fliptets->tet[this->volumeboundindex];
  }
  if (hullflag < 1) {
    iVar12 = fliptets->ver;
    fliptets->tet[orgpivot[iVar12]] = p0;
    fliptets->tet[destpivot[iVar12]] = (tetrahedron)this_00;
    fliptets->tet[apexpivot[iVar12]] = ppdVar2;
    fliptets->tet[oppopivot[iVar12]] = p3;
    iVar12 = fliptets[1].ver;
    fliptets[1].tet[orgpivot[iVar12]] = p0;
    fliptets[1].tet[destpivot[iVar12]] = (tetrahedron)this_00;
    fliptets[1].tet[apexpivot[iVar12]] = p3;
    fliptets[1].tet[oppopivot[iVar12]] = (tetrahedron)p3_00;
    iVar12 = fliptets[2].ver;
    fliptets[2].tet[orgpivot[iVar12]] = p0;
    fliptets[2].tet[destpivot[iVar12]] = (tetrahedron)this_00;
    fliptets[2].tet[apexpivot[iVar12]] = (tetrahedron)p3_00;
    fliptets[2].tet[oppopivot[iVar12]] = ppdVar2;
  }
  else {
    iVar12 = fliptets->ver;
    if (this_00 == (tetgenmesh *)this->dummypoint) {
      fliptets->tet[orgpivot[iVar12]] = ppdVar2;
      fliptets->tet[destpivot[iVar12]] = p3;
      fliptets->tet[apexpivot[iVar12]] = p0;
      fliptets->tet[oppopivot[iVar12]] = (tetrahedron)this_00;
      iVar12 = fliptets[1].ver;
      fliptets[1].tet[orgpivot[iVar12]] = p3;
      fliptets[1].tet[destpivot[iVar12]] = (tetrahedron)p3_00;
      fliptets[1].tet[apexpivot[iVar12]] = p0;
      fliptets[1].tet[oppopivot[iVar12]] = (tetrahedron)this_00;
      iVar12 = fliptets[2].ver;
      fliptets[2].tet[orgpivot[iVar12]] = (tetrahedron)p3_00;
      fliptets[2].tet[destpivot[iVar12]] = ppdVar2;
      fliptets[2].tet[apexpivot[iVar12]] = p0;
      fliptets[2].tet[oppopivot[iVar12]] = (tetrahedron)this_00;
      for (lVar7 = 8; lVar7 != 0x38; lVar7 = lVar7 + 0x10) {
        iVar12 = eprevesymtbl[*(int *)((long)&fliptets->tet + lVar7)];
        *(int *)((long)&fliptets->tet + lVar7) = iVar12;
        *(int *)((long)&fliptets->tet + lVar7) = enexttbl[iVar12];
      }
      this->hullsize = this->hullsize + 2;
    }
    else {
      fliptets->tet[orgpivot[iVar12]] = p0;
      fliptets->tet[destpivot[iVar12]] = (tetrahedron)this_00;
      fliptets->tet[apexpivot[iVar12]] = ppdVar2;
      fliptets->tet[oppopivot[iVar12]] = p3;
      iVar12 = fliptets[1].ver;
      fliptets[1].tet[orgpivot[iVar12]] = p0;
      fliptets[1].tet[destpivot[iVar12]] = (tetrahedron)this_00;
      fliptets[1].tet[apexpivot[iVar12]] = p3;
      fliptets[1].tet[oppopivot[iVar12]] = (tetrahedron)p3_00;
      iVar12 = fliptets[2].ver;
      if (p3_00 == (tetgenmesh *)this->dummypoint) {
        fliptets[2].tet[orgpivot[iVar12]] = (tetrahedron)this_00;
        fliptets[2].tet[destpivot[iVar12]] = p0;
        fliptets[2].tet[apexpivot[iVar12]] = ppdVar2;
        fliptets[2].tet[oppopivot[iVar12]] = (tetrahedron)p3_00;
        fliptets[2].ver = esymtbl[iVar12];
      }
      else {
        fliptets[2].tet[orgpivot[iVar12]] = p0;
        ptVar1->tet[destpivot[iVar12]] = (tetrahedron)this_00;
        ptVar1->tet[apexpivot[iVar12]] = (tetrahedron)p3_00;
        ptVar1->tet[oppopivot[iVar12]] = ppdVar2;
      }
    }
  }
  if (local_110->remove_ndelaunay_edge != 0) {
    ptVar5 = (tetgenmesh *)this->dummypoint;
    ptVar18 = this_00;
    if (this_00 == ptVar5) {
      local_b8 = 0.0;
      local_b0 = 0.0;
      local_a8 = 0.0;
      local_a0 = 0.0;
LAB_00114063:
      pfVar16 = local_110;
      dVar23 = tetprismvol(ptVar18,(double *)p3,(double *)ppdVar2,(double *)p3_00,(double *)p0);
      dVar22 = local_a0;
    }
    else {
      dVar22 = tetprismvol(this_00,(double *)p0,(double *)this_00,(double *)ppdVar2,(double *)p3);
      if (p3_00 != ptVar5) {
        local_a0 = dVar22;
        local_a8 = tetprismvol(ptVar18,(double *)p0,(double *)this_00,(double *)p3,(double *)p3_00);
        local_b0 = tetprismvol(ptVar18,(double *)p0,(double *)this_00,(double *)p3_00,
                               (double *)ppdVar2);
        local_b8 = tetprismvol(ptVar18,(double *)ppdVar2,(double *)p3,(double *)p3_00,
                               (double *)this_00);
        goto LAB_00114063;
      }
      dVar23 = 0.0;
      local_b8 = 0.0;
      local_b0 = 0.0;
      local_a8 = 0.0;
      pfVar16 = local_110;
    }
    pfVar16->tetprism_vol_sum =
         (((local_a8 + dVar22 + local_b0) - local_b8) - dVar23) + pfVar16->tetprism_vol_sum;
  }
  lVar19 = 8;
  for (lVar7 = 1; pfVar16 = local_110, lVar7 != 4; lVar7 = lVar7 + 1) {
    local_120.tet = *(tetrahedron **)((long)fliptets + lVar19 + -8);
    local_120.ver = esymtbl[*(int *)((long)&fliptets->tet + lVar19)];
    lVar15 = lVar7;
    if (lVar19 == 0x28) {
      lVar15 = 0;
    }
    bond(this,&local_120,fliptets + lVar15);
    lVar19 = lVar19 + 0x10;
  }
  for (lVar7 = 0; lVar7 != 0x30; lVar7 = lVar7 + 0x10) {
    local_120.tet = *(tetrahedron **)((long)&fliptets->tet + lVar7);
    local_120.ver = eorgoppotbl[*(int *)((long)&fliptets->ver + lVar7)];
    bond(this,&local_120,(triface *)((long)&topcastets[0].tet + lVar7));
  }
  for (lVar7 = 0; lVar7 != 0x30; lVar7 = lVar7 + 0x10) {
    local_120.tet = *(tetrahedron **)((long)&fliptets->tet + lVar7);
    local_120.ver = edestoppotbl[*(int *)((long)&fliptets->ver + lVar7)];
    bond(this,&local_120,(triface *)((long)&botcastets[0].tet + lVar7));
  }
  if (this->checksubsegflag != 0) {
    checkseg.sh = (shellface *)0x0;
    checkseg.shver = 0;
    for (lVar7 = 0; lVar7 != 0x30; lVar7 = lVar7 + 0x10) {
      lVar19 = *(long *)(*(long *)((long)&topcastets[0].tet + lVar7) + 0x40);
      if ((lVar19 != 0) &&
         (*(long *)(lVar19 + (long)ver2edge[*(int *)((long)&topcastets[0].ver + lVar7)] * 8) != 0))
      {
        tsspivot1(this,(triface *)((long)&topcastets[0].tet + lVar7),&checkseg);
        local_120.tet = *(tetrahedron **)((long)&fliptets->tet + lVar7);
        local_120.ver = eorgoppotbl[*(int *)((long)&fliptets->ver + lVar7)];
        tssbond1(this,&local_120,&checkseg);
        checkseg.sh[9] = (shellface)((long)local_120.ver | (ulong)local_120.tet);
        if ((pfVar16->chkencflag & 1) != 0) {
          enqueuesubface(this,this->badsubsegs,&checkseg);
        }
      }
    }
    uVar13 = 0xffffffff;
    for (lVar7 = 0; uVar20 = 0xffffffff, lVar7 != 0x30; lVar7 = lVar7 + 0x10) {
      lVar19 = *(long *)(*(long *)((long)&topcastets[0].tet + lVar7) + 0x40);
      if ((lVar19 != 0) &&
         (uVar20 = *(ulong *)(lVar19 + (long)ver2edge[eprevtbl[*(int *)((long)&topcastets[0].ver +
                                                                       lVar7)]] * 8), uVar20 != 0))
      {
        checkseg.shver = (uint)uVar20 & 7;
        checkseg.sh = (shellface *)(uVar20 & 0xfffffffffffffff8);
        local_120.tet = *(tetrahedron **)((long)&fliptets->tet + lVar7);
        local_120.ver = enexttbl[*(int *)((long)&fliptets->ver + lVar7)];
        tssbond1(this,&local_120,&checkseg);
        uVar20 = uVar13 & 0xffffffff;
        if (lVar7 == 0) {
          uVar20 = 2;
        }
        checkseg.sh[9] = (shellface)((long)local_120.ver | (ulong)local_120.tet);
        local_120.tet = fliptets[uVar20].tet;
        local_120.ver = eprevtbl[esymtbl[fliptets[uVar20].ver]];
        tssbond1(this,&local_120,&checkseg);
        checkseg.sh[9] = (shellface)((long)local_120.ver | (ulong)local_120.tet);
        if ((local_110->chkencflag & 1) != 0) {
          enqueuesubface(this,this->badsubsegs,&checkseg);
        }
      }
      uVar13 = uVar13 + 1;
    }
    for (lVar7 = 0; pfVar16 = local_110, lVar7 != 0x30; lVar7 = lVar7 + 0x10) {
      lVar19 = *(long *)(*(long *)((long)&botcastets[0].tet + lVar7) + 0x40);
      if ((lVar19 != 0) &&
         (uVar13 = *(ulong *)(lVar19 + (long)ver2edge[enexttbl[*(int *)((long)&botcastets[0].ver +
                                                                       lVar7)]] * 8), uVar13 != 0))
      {
        checkseg.shver = (uint)uVar13 & 7;
        checkseg.sh = (shellface *)(uVar13 & 0xfffffffffffffff8);
        local_120.tet = *(tetrahedron **)((long)&fliptets->tet + lVar7);
        local_120.ver = eprevtbl[*(int *)((long)&fliptets->ver + lVar7)];
        tssbond1(this,&local_120,&checkseg);
        uVar13 = uVar20 & 0xffffffff;
        if (lVar7 == 0) {
          uVar13 = 2;
        }
        checkseg.sh[9] = (shellface)((long)local_120.ver | (ulong)local_120.tet);
        local_120.tet = fliptets[uVar13].tet;
        local_120.ver = enexttbl[esymtbl[fliptets[uVar13].ver]];
        tssbond1(this,&local_120,&checkseg);
        checkseg.sh[9] = (shellface)((long)local_120.ver | (ulong)local_120.tet);
        if ((local_110->chkencflag & 1) != 0) {
          enqueuesubface(this,this->badsubsegs,&checkseg);
        }
      }
      uVar20 = uVar20 + 1;
    }
  }
  if (this->checksubfaceflag != 0) {
    checkseg.sh = (shellface *)0x0;
    checkseg.shver = 0;
    for (lVar7 = 0; lVar7 != 0x30; lVar7 = lVar7 + 0x10) {
      lVar19 = *(long *)(*(long *)((long)&topcastets[0].tet + lVar7) + 0x48);
      if ((lVar19 != 0) &&
         (*(long *)(lVar19 + (ulong)(*(uint *)((long)&topcastets[0].ver + lVar7) & 3) * 8) != 0)) {
        tspivot(this,(triface *)((long)&topcastets[0].tet + lVar7),&checkseg);
        local_120.tet = *(tetrahedron **)((long)&fliptets->tet + lVar7);
        local_120.ver = eorgoppotbl[*(int *)((long)&fliptets->ver + lVar7)];
        checkseg.shver = checkseg.shver ^ 1;
        tsbond(this,&local_120,&checkseg);
        if ((pfVar16->chkencflag & 2) != 0) {
          enqueuesubface(this,this->badsubfacs,&checkseg);
        }
      }
    }
    for (lVar7 = 0; lVar7 != 0x30; lVar7 = lVar7 + 0x10) {
      lVar19 = *(long *)(*(long *)((long)&botcastets[0].tet + lVar7) + 0x48);
      if ((lVar19 != 0) &&
         (*(long *)(lVar19 + (ulong)(*(uint *)((long)&botcastets[0].ver + lVar7) & 3) * 8) != 0)) {
        tspivot(this,(triface *)((long)&botcastets[0].tet + lVar7),&checkseg);
        local_120.tet = *(tetrahedron **)((long)&fliptets->tet + lVar7);
        local_120.ver = edestoppotbl[*(int *)((long)&fliptets->ver + lVar7)];
        checkseg.shver = checkseg.shver ^ 1;
        tsbond(this,&local_120,&checkseg);
        if ((pfVar16->chkencflag & 2) != 0) {
          enqueuesubface(this,this->badsubfacs,&checkseg);
        }
      }
    }
  }
  if ((pfVar16->chkencflag & 4) != 0) {
    for (lVar7 = 0; lVar7 != 0x30; lVar7 = lVar7 + 0x10) {
      enqueuetetrahedron(this,(triface *)((long)&fliptets->tet + lVar7));
    }
  }
  pppdVar10 = fliptets->tet;
  iVar12 = this->point2simindex;
  ppdVar2[iVar12] = (double *)pppdVar10;
  p3[iVar12] = (double *)pppdVar10;
  (&p3_00->in)[iVar12] = (tetgenio *)fliptets[1].tet;
  ptVar6 = (tetgenio *)fliptets->tet;
  (&this_00->in)[iVar12] = ptVar6;
  p0[iVar12] = (double *)ptVar6;
  if ((char)local_fc == '\x01' && 0 < hullflag) {
    if ((char)local_100 == '\0') {
      pppdVar10 = fliptets->tet;
      iVar12 = fliptets->ver;
      if ((char)local_104 != '\0') {
        fliptets->tet = fliptets[2].tet;
        fliptets->ver = fliptets[2].ver;
        fliptets[2].tet = fliptets[1].tet;
        fliptets[2].ver = fliptets[1].ver;
        fliptets[1].tet = pppdVar10;
        fliptets[1].ver = iVar12;
        goto LAB_00114741;
      }
      fliptets->tet = fliptets[1].tet;
      fliptets->ver = fliptets[1].ver;
    }
    else {
      for (lVar7 = 8; lVar7 != 0x38; lVar7 = lVar7 + 0x10) {
        *(int *)((long)&fliptets->tet + lVar7) = esymtbl[*(int *)((long)&fliptets->tet + lVar7)];
      }
      pppdVar10 = fliptets[1].tet;
      iVar12 = fliptets[1].ver;
    }
    fliptets[1].tet = fliptets[2].tet;
    fliptets[1].ver = fliptets[2].ver;
    fliptets[2].tet = pppdVar10;
    fliptets[2].ver = iVar12;
  }
LAB_00114741:
  if (0 < pfVar16->enqflag) {
    for (lVar7 = 8; lVar7 != 0x38; lVar7 = lVar7 + 0x10) {
      local_120.tet = *(tetrahedron **)((long)fliptets + lVar7 + -8);
      local_120.ver = eprevesymtbl[*(int *)((long)&fliptets->tet + lVar7)];
      flippush(this,&this->flipstack,&local_120);
    }
    if (1 < local_110->enqflag) {
      for (lVar7 = 8; lVar7 != 0x38; lVar7 = lVar7 + 0x10) {
        local_120.tet = *(tetrahedron **)((long)fliptets + lVar7 + -8);
        local_120.ver = enextesymtbl[*(int *)((long)&fliptets->tet + lVar7)];
        flippush(this,&this->flipstack,&local_120);
      }
    }
  }
  (this->recenttet).tet = fliptets->tet;
  (this->recenttet).ver = fliptets->ver;
  return;
}

Assistant:

void tetgenmesh::flip23(triface* fliptets, int hullflag, flipconstraints *fc)
{
  triface topcastets[3], botcastets[3];
  triface newface, casface;
  point pa, pb, pc, pd, pe;
  REAL attrib, volume;
  int dummyflag = 0;  // range = {-1, 0, 1, 2}.
  int i;

  if (hullflag > 0) {
    // Check if e is dummypoint.
    if (oppo(fliptets[1]) == dummypoint) {
      // Swap the two old tets.
      newface = fliptets[0];
      fliptets[0] = fliptets[1];
      fliptets[1] = newface;
      dummyflag = -1;  // d is dummypoint.
    } else {
      // Check if either a or b is dummypoint.
      if (org(fliptets[0]) == dummypoint) {
        dummyflag = 1; // a is dummypoint.
        enextself(fliptets[0]);
        eprevself(fliptets[1]);
      } else if (dest(fliptets[0]) == dummypoint) {
        dummyflag = 2; // b is dummypoint.
        eprevself(fliptets[0]);
        enextself(fliptets[1]);
      } else {
        dummyflag = 0; // either c or d may be dummypoint.
      }
    }
  }

  pa =  org(fliptets[0]);
  pb = dest(fliptets[0]);
  pc = apex(fliptets[0]);
  pd = oppo(fliptets[0]);
  pe = oppo(fliptets[1]);

  flip23count++;

  // Get the outer boundary faces.
  for (i = 0; i < 3; i++) {
    fnext(fliptets[0], topcastets[i]);
    enextself(fliptets[0]);
  }
  for (i = 0; i < 3; i++) {
    fnext(fliptets[1], botcastets[i]);
    eprevself(fliptets[1]);
  }

  // Re-use fliptets[0] and fliptets[1].
  fliptets[0].ver = 11;
  fliptets[1].ver = 11;
  setelemmarker(fliptets[0].tet, 0); // Clear all flags.
  setelemmarker(fliptets[1].tet, 0);
  // NOTE: the element attributes and volume constraint remain unchanged.
  if (checksubsegflag) {
    // Dealloc the space to subsegments.
    if (fliptets[0].tet[8] != NULL) {
      tet2segpool->dealloc((shellface *) fliptets[0].tet[8]);
      fliptets[0].tet[8] = NULL;
    }
    if (fliptets[1].tet[8] != NULL) {
      tet2segpool->dealloc((shellface *) fliptets[1].tet[8]);
      fliptets[1].tet[8] = NULL;
    }
  }
  if (checksubfaceflag) {
    // Dealloc the space to subfaces.
    if (fliptets[0].tet[9] != NULL) {
      tet2subpool->dealloc((shellface *) fliptets[0].tet[9]);
      fliptets[0].tet[9] = NULL;
    }
    if (fliptets[1].tet[9] != NULL) {
      tet2subpool->dealloc((shellface *) fliptets[1].tet[9]);
      fliptets[1].tet[9] = NULL;
    }
  }
  // Create a new tet.
  maketetrahedron(&(fliptets[2]));
  // The new tet have the same attributes from the old tet.
  for (i = 0; i < numelemattrib; i++) {
    attrib = elemattribute(fliptets[0].tet, i);
    setelemattribute(fliptets[2].tet, i, attrib);
  }
  if (b->varvolume) {
    volume = volumebound(fliptets[0].tet);
    setvolumebound(fliptets[2].tet, volume);
  }

  if (hullflag > 0) {
    // Check if d is dummytet.
    if (pd != dummypoint) {
      setvertices(fliptets[0], pe, pd, pa, pb); // [e,d,a,b] *
      setvertices(fliptets[1], pe, pd, pb, pc); // [e,d,b,c] *
      // Check if c is dummypoint.
      if (pc != dummypoint) {
        setvertices(fliptets[2], pe, pd, pc, pa);  // [e,d,c,a] *
      } else {
        setvertices(fliptets[2], pd, pe, pa, pc); // [d,e,a,c]
        esymself(fliptets[2]);                    // [e,d,c,a] *
      }
      // The hullsize does not change.
    } else {
      // d is dummypoint.
      setvertices(fliptets[0], pa, pb, pe, pd); // [a,b,e,d]
      setvertices(fliptets[1], pb, pc, pe, pd); // [b,c,e,d]
      setvertices(fliptets[2], pc, pa, pe, pd); // [c,a,e,d]
      // Adjust the faces to [e,d,a,b], [e,d,b,c], [e,d,c,a] *
      for (i = 0; i < 3; i++) {
        eprevesymself(fliptets[i]);
        enextself(fliptets[i]);
      }
      // We deleted one hull tet, and created three hull tets.
      hullsize += 2;
    }
  } else {
    setvertices(fliptets[0], pe, pd, pa, pb); // [e,d,a,b] *
    setvertices(fliptets[1], pe, pd, pb, pc); // [e,d,b,c] *
    setvertices(fliptets[2], pe, pd, pc, pa); // [e,d,c,a] *
  }

  if (fc->remove_ndelaunay_edge) { // calc_tetprism_vol
    REAL volneg[2], volpos[3], vol_diff;
    if (pd != dummypoint) {
      if (pc != dummypoint) {
        volpos[0] = tetprismvol(pe, pd, pa, pb);
        volpos[1] = tetprismvol(pe, pd, pb, pc);
        volpos[2] = tetprismvol(pe, pd, pc, pa);
        volneg[0] = tetprismvol(pa, pb, pc, pd);
        volneg[1] = tetprismvol(pb, pa, pc, pe);
      } else { // pc == dummypoint
        volpos[0] = tetprismvol(pe, pd, pa, pb);
        volpos[1] = 0.;
        volpos[2] = 0.;
        volneg[0] = 0.;
        volneg[1] = 0.;
      }
    } else { // pd == dummypoint.
      volpos[0] = 0.;
      volpos[1] = 0.;
      volpos[2] = 0.;
      volneg[0] = 0.;
      volneg[1] = tetprismvol(pb, pa, pc, pe);
    }
    vol_diff = volpos[0] + volpos[1] + volpos[2] - volneg[0] - volneg[1];
    fc->tetprism_vol_sum  += vol_diff; // Update the total sum.
  }

  // Bond three new tets together.
  for (i = 0; i < 3; i++) {
    esym(fliptets[i], newface);
    bond(newface, fliptets[(i + 1) % 3]);
  }
  // Bond to top outer boundary faces (at [a,b,c,d]).
  for (i = 0; i < 3; i++) {
    eorgoppo(fliptets[i], newface); // At edges [b,a], [c,b], [a,c].
    bond(newface, topcastets[i]);
  }
  // Bond bottom outer boundary faces (at [b,a,c,e]).
  for (i = 0; i < 3; i++) {
    edestoppo(fliptets[i], newface); // At edges [a,b], [b,c], [c,a].
    bond(newface, botcastets[i]);
  }

  if (checksubsegflag) {
    // Bond subsegments if there are.
    // Each new tet has 5 edges to be checked (except the edge [e,d]). 
    face checkseg;
    // The middle three: [a,b], [b,c], [c,a].
    for (i = 0; i < 3; i++) {      
      if (issubseg(topcastets[i])) {
        tsspivot1(topcastets[i], checkseg);
        eorgoppo(fliptets[i], newface);
        tssbond1(newface, checkseg);
        sstbond1(checkseg, newface);
        if (fc->chkencflag & 1) {
          enqueuesubface(badsubsegs, &checkseg);
        }
      }
    }
    // The top three: [d,a], [d,b], [d,c]. Two tets per edge.
    for (i = 0; i < 3; i++) {
      eprev(topcastets[i], casface);      
      if (issubseg(casface)) {
        tsspivot1(casface, checkseg);
        enext(fliptets[i], newface);
        tssbond1(newface, checkseg);
        sstbond1(checkseg, newface);
        esym(fliptets[(i + 2) % 3], newface);
        eprevself(newface);
        tssbond1(newface, checkseg);
        sstbond1(checkseg, newface);
        if (fc->chkencflag & 1) {
          enqueuesubface(badsubsegs, &checkseg);
        }
      }
    }
    // The bot three: [a,e], [b,e], [c,e]. Two tets per edge.
    for (i = 0; i < 3; i++) {
      enext(botcastets[i], casface);
      if (issubseg(casface)) {
        tsspivot1(casface, checkseg);
        eprev(fliptets[i], newface);
        tssbond1(newface, checkseg);
        sstbond1(checkseg, newface);
        esym(fliptets[(i + 2) % 3], newface);
        enextself(newface);
        tssbond1(newface, checkseg);
        sstbond1(checkseg, newface);
        if (fc->chkencflag & 1) {
          enqueuesubface(badsubsegs, &checkseg);
        }
      }
    }
  } // if (checksubsegflag)

  if (checksubfaceflag) {
    // Bond 6 subfaces if there are.
    face checksh;
    for (i = 0; i < 3; i++) {      
      if (issubface(topcastets[i])) {
        tspivot(topcastets[i], checksh);
        eorgoppo(fliptets[i], newface);
        sesymself(checksh);
        tsbond(newface, checksh);
        if (fc->chkencflag & 2) {
          enqueuesubface(badsubfacs, &checksh);
        }
      }
    }
    for (i = 0; i < 3; i++) {
      if (issubface(botcastets[i])) {
        tspivot(botcastets[i], checksh);
        edestoppo(fliptets[i], newface);
        sesymself(checksh);
        tsbond(newface, checksh);
        if (fc->chkencflag & 2) {
          enqueuesubface(badsubfacs, &checksh);
        }
      }
    }
  } // if (checksubfaceflag)

  if (fc->chkencflag & 4) {
    // Put three new tets into check list.
    for (i = 0; i < 3; i++) {
      enqueuetetrahedron(&(fliptets[i]));
    }
  }

  // Update the point-to-tet map.
  setpoint2tet(pa, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pb, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pc, (tetrahedron) fliptets[1].tet);
  setpoint2tet(pd, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pe, (tetrahedron) fliptets[0].tet);

  if (hullflag > 0) {
    if (dummyflag != 0) {
      // Restore the original position of the points (for flipnm()).
      if (dummyflag == -1) { 
        // Reverse the edge.
        for (i = 0; i < 3; i++) {
          esymself(fliptets[i]);
        }
        // Swap the last two new tets.
        newface = fliptets[1];
        fliptets[1] = fliptets[2];
        fliptets[2] = newface;
      } else {
        // either a or b were swapped.
        if (dummyflag == 1) {
          // a is dummypoint.
          newface = fliptets[0];
          fliptets[0] = fliptets[2];
          fliptets[2] = fliptets[1];
          fliptets[1] = newface;
        } else { // dummyflag == 2
          // b is dummypoint.
          newface = fliptets[0];
          fliptets[0] = fliptets[1];
          fliptets[1] = fliptets[2];
          fliptets[2] = newface;
        }
      }
    }
  }

  if (fc->enqflag > 0) {
    // Queue faces which may be locally non-Delaunay.  
    for (i = 0; i < 3; i++) {
      eprevesym(fliptets[i], newface);
      flippush(flipstack, &newface);
    }
    if (fc->enqflag > 1) {
      for (i = 0; i < 3; i++) {
        enextesym(fliptets[i], newface);
        flippush(flipstack, &newface);
      }
    }
  }

  recenttet = fliptets[0];
}